

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,double kappa,double delta)

{
  double *args_3;
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  uint local_68;
  int local_64;
  double local_60;
  int local_54;
  long local_50;
  undefined1 local_48 [16];
  
  local_50 = (long)k;
  args_3 = (double *)(*(long *)(this + 0x78) + local_50 * 8);
  dVar10 = *args_3;
  local_48._8_8_ = 0;
  local_48._0_8_ = dVar10;
  local_60 = kappa / (1.0 - kappa) + delta;
  local_68 = r_size;
  local_64 = selected;
  local_54 = k;
  if (selected < 0) {
    pdVar1 = *(double **)(this + 0x60);
    *args_3 = dVar10 + *pdVar1 * 0.5;
    fmt_00._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
    fmt_00._M_len = 0x23;
    debug_logger<true>::log<int,int,double,double>
              ((debug_logger<true> *)this,fmt_00,&local_64,(int *)&local_68,pdVar1,args_3);
    if (local_68 != 0) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        iVar3 = *(int *)(*(long *)(this + 0x60) + lVar7);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar3].column);
        *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
             *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) - local_60;
        dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::local_compute_reduced_cost<baryonyx::bit_array>
                           ((solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                             *)this,it[iVar3].column,x);
        if (dVar10 <= 0.0) {
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
               (dVar10 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8)) - local_60
          ;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar8 != local_68);
    }
  }
  else {
    lVar7 = *(long *)(this + 0x60);
    dVar2 = *(double *)(lVar7 + (ulong)(uint)selected * 0x10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar2;
    pdVar1 = (double *)(lVar7 + (ulong)(uint)selected * 0x10);
    if ((int)(selected + 1U) < r_size) {
      lVar5 = (ulong)(selected + 1U) * 0x10;
      *args_3 = dVar10 + (dVar2 + *(double *)(lVar7 + lVar5)) * 0.5;
      fmt._M_str = "    selected: {}/{} ({}x{})/2 = pi {}\n";
      fmt._M_len = 0x26;
      debug_logger<true>::log<int,int,double,double,double>
                ((debug_logger<true> *)this,fmt,&local_64,(int *)&local_68,pdVar1,
                 (double *)(lVar7 + lVar5),args_3);
      if (local_64 < 0) {
        uVar6 = 0;
      }
      else {
        lVar7 = -1;
        lVar5 = 8;
        do {
          iVar3 = *(int *)(*(long *)(this + 0x60) + lVar5);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar3].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
               local_60 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8);
          dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                               *)this,it[iVar3].column,x);
          if (0.0 <= dVar10) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
                 (*(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) - dVar10) +
                 local_60;
          }
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + 0x10;
        } while (lVar7 < local_64);
        uVar6 = (int)lVar7 + 1;
      }
      if (uVar6 != local_68) {
        uVar9 = (ulong)uVar6;
        uVar8 = uVar9 << 4 | 8;
        do {
          iVar3 = *(int *)(*(long *)(this + 0x60) + uVar8);
          bit_array_impl::unset(&x->super_bit_array_impl,it[iVar3].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
               *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) - local_60;
          dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                               *)this,it[iVar3].column,x);
          if (dVar10 <= 0.0) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
                 (dVar10 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8)) -
                 local_60;
          }
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 + 0x10;
        } while (uVar9 != local_68);
      }
    }
    else {
      auVar11 = vfmadd132sd_fma(auVar11,local_48,ZEXT816(0x3ff8000000000000));
      *args_3 = auVar11._0_8_;
      fmt_01._M_str = "    selected: {}/{} ({})/2 = pi {}\n";
      fmt_01._M_len = 0x23;
      debug_logger<true>::log<int,int,double,double>
                ((debug_logger<true> *)this,fmt_01,&local_64,(int *)&local_68,pdVar1,args_3);
      if (local_68 != 0) {
        lVar7 = 8;
        uVar8 = 0;
        do {
          iVar3 = *(int *)(*(long *)(this + 0x60) + lVar7);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar3].column);
          *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
               local_60 + *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8);
          dVar10 = solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                   ::local_compute_reduced_cost<baryonyx::bit_array>
                             ((solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                               *)this,it[iVar3].column,x);
          if (0.0 <= dVar10) {
            *(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) =
                 (*(double *)(*(long *)(this + 0x50) + (long)it[iVar3].value * 8) - dVar10) +
                 local_60;
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar8 != local_68);
      }
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                      *)this,local_54,x);
  if (!bVar4) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  uVar6 = vmovmskpd_avx(local_48);
  return (bool)((byte)((byte)(((ulong)uVar6 << 0x3f) >> 0x38) ^
                      (byte)((ulong)*(undefined8 *)(*(long *)(this + 0x78) + local_50 * 8) >> 0x38))
               >> 7);
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }